

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitTryTable(PrintExpressionContents *this,TryTable *curr)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 auVar3 [16];
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  char local_33 [3];
  
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"try_table",9);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id) {
    local_33[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33,1);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.
                   id;
    PrintSExpression::printBlockType(this->parent,(Signature)(auVar3 << 0x40));
  }
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this->o," (",2);
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar5) {
LAB_00a42e6c:
        pcVar4 = 
        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
        ;
LAB_00a42e98:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,pcVar4);
      }
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar5].
          super_IString.str._M_str != (char *)0x0) {
        if ((curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements <= uVar5)
        {
LAB_00a42e83:
          pcVar4 = 
          "T &ArenaVectorBase<ArenaVector<bool>, bool>::operator[](size_t) const [SubType = ArenaVector<bool>, T = bool]"
          ;
          goto LAB_00a42e98;
        }
        poVar2 = this->o;
        bVar1 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar5];
        pcVar4 = "catch ";
        if (bVar1 != false) {
          pcVar4 = "catch_ref ";
        }
        Colors::outputColorCode(poVar2,"\x1b[35m");
        Colors::outputColorCode(poVar2,"\x1b[1m");
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,(ulong)bVar1 * 4 + 6);
        Colors::outputColorCode(poVar2,"\x1b[0m");
        if (uVar5 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                    usedElements) {
          Name::print((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      data + uVar5,this->o);
          local_33[2] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33 + 2,1);
          goto LAB_00a42e1a;
        }
        goto LAB_00a42e6c;
      }
      if ((curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements <= uVar5)
      goto LAB_00a42e83;
      poVar2 = this->o;
      bVar1 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar5];
      pcVar4 = "catch_all ";
      if (bVar1 != false) {
        pcVar4 = "catch_all_ref ";
      }
      Colors::outputColorCode(poVar2,"\x1b[35m");
      Colors::outputColorCode(poVar2,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,(ulong)bVar1 * 4 + 10);
      Colors::outputColorCode(poVar2,"\x1b[0m");
LAB_00a42e1a:
      if ((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar5) goto LAB_00a42e6c;
      Name::print((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
                  + uVar5,this->o);
      local_33[1] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33 + 1,1);
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     usedElements);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    printMedium(o, "try_table");
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
    for (Index i = 0; i < curr->catchTags.size(); i++) {
      o << " (";
      if (curr->catchTags[i]) {
        printMedium(o, curr->catchRefs[i] ? "catch_ref " : "catch ");
        curr->catchTags[i].print(o);
        o << ' ';
      } else {
        printMedium(o, curr->catchRefs[i] ? "catch_all_ref " : "catch_all ");
      }
      curr->catchDests[i].print(o);
      o << ')';
    }
  }